

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

string_t * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::get_token_string(string_t *__return_storage_ptr__,lexer *this)

{
  lexer_char_t *plVar1;
  lexer_char_t *plVar2;
  
  plVar1 = this->m_start;
  if (plVar1 != (lexer_char_t *)0x0) {
    plVar2 = this->m_cursor;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,plVar1,plVar2);
    return __return_storage_ptr__;
  }
  __assert_fail("m_start != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/NikitaEvs[P]WildHack/thirdparty/json/json.hpp"
                ,0x29a8,
                "string_t nlohmann::basic_json<>::lexer::get_token_string() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
               );
}

Assistant:

string_t get_token_string() const
        {
            assert(m_start != nullptr);
            return string_t(reinterpret_cast<typename string_t::const_pointer>(m_start),
                            static_cast<size_t>(m_cursor - m_start));
        }